

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O1

void __thiscall catalog::writeBacktoFile(catalog *this)

{
  int *piVar1;
  TableInfo *pTVar2;
  ostream *poVar3;
  long lVar4;
  ofstream tablelist;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  if (this->anychangeornot == true) {
    std::ofstream::ofstream(&local_230,"./file/catalog/table.dat",_S_trunc|_S_out|_S_bin);
    piVar1 = &this->tableNumber;
    std::ostream::write((char *)&local_230,(long)piVar1);
    if (0 < *piVar1) {
      lVar4 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"writing back table  -------------------------",0x2d);
        pTVar2 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar4];
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(pTVar2->tableName)._M_dataplus._M_p,
                            (pTVar2->tableName)._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        writeTabletoFile(this,(this->TableInfoList).
                              super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar4],(ofstream *)&local_230);
        lVar4 = lVar4 + 1;
      } while (lVar4 < *piVar1);
    }
    std::ofstream::close();
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void catalog::writeBacktoFile(){
    if(anychangeornot){
        std::ofstream tablelist("./file/catalog/table.dat", std::ios::out | std::ios::binary | std::ios::trunc);
        tablelist.write(reinterpret_cast<char*>(&tableNumber), sizeof(int));
        for(int i = 0 ; i < tableNumber ; i++){
            std::cout<<"writing back table  -------------------------"<<TableInfoList[i]->tableName<<std::endl;
            writeTabletoFile(TableInfoList[i],tablelist);
        }
        tablelist.close();
    }
    return;
}